

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayGenericFold<double,duckdb::CosineDistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  BoundFunctionExpression *pBVar7;
  reference pvVar8;
  Vector *vector;
  Vector *vector_00;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ulong uVar11;
  InvalidInputException *pIVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_178;
  double local_158;
  double dStack_150;
  string local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(args + 0x18);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar8);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar8);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,(UnifiedVectorFormat *)pbVar3);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,(UnifiedVectorFormat *)pbVar3);
  lVar4 = *(long *)(vector + 0x20);
  lVar5 = *(long *)(vector_00 + 0x20);
  lVar6 = *(long *)(result + 0x20);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  lVar9 = duckdb::ArrayType::GetSize((LogicalType *)(pvVar8 + 8));
  if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar10 = pbVar15;
      if (*local_78[0] != 0) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_78[0] + (long)pbVar15 * 4);
      }
      pbVar13 = pbVar15;
      if (*local_c0[0] != 0) {
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_c0[0] + (long)pbVar15 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + ((ulong)pbVar10 >> 6) * 8) >> ((ulong)pbVar10 & 0x3f) & 1) != 0))
         && ((local_b0 == 0 ||
             ((*(ulong *)(local_b0 + ((ulong)pbVar13 >> 6) * 8) >> ((ulong)pbVar13 & 0x3f) & 1) != 0
             )))) {
        uVar11 = (long)pbVar10 * lVar9;
        lVar14 = *(long *)(vector + 0x28);
        if (lVar14 != 0) {
          bVar19 = uVar11 + lVar9 <= uVar11;
          if ((!bVar19) &&
             (lVar16 = lVar9 + -1, uVar17 = uVar11,
             (*(ulong *)(lVar14 + (uVar11 >> 6) * 8) >> (uVar11 & 0x3f) & 1) != 0)) {
            do {
              uVar17 = uVar17 + 1;
              if (lVar16 == 0) break;
              lVar16 = lVar16 + -1;
            } while ((*(ulong *)(lVar14 + (uVar17 >> 6) * 8) >> (uVar17 & 0x3f) & 1) != 0);
            bVar19 = uVar11 + lVar9 <= uVar17;
          }
          if (!bVar19) {
            pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_e0[0] = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"%s: left argument can not contain NULL values","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,*(long *)(pBVar7 + 0x60),
                       *(long *)(pBVar7 + 0x68) + *(long *)(pBVar7 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_178,(StringUtil *)local_e0,&local_100,pbVar13);
            duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_178);
            __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar13 * lVar9);
        lVar14 = *(long *)(vector_00 + 0x28);
        if (lVar14 != 0) {
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar13->_M_dataplus)._M_p + lVar9);
          bVar19 = pbVar10 <= pbVar13;
          if ((!bVar19) &&
             (lVar16 = lVar9 + -1, pbVar18 = pbVar13,
             (*(ulong *)(lVar14 + ((ulong)pbVar13 >> 6) * 8) >> ((ulong)pbVar13 & 0x3f) & 1) != 0))
          {
            do {
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar18->_M_dataplus)._M_p + 1);
              if (lVar16 == 0) break;
              lVar16 = lVar16 + -1;
            } while ((*(ulong *)(lVar14 + ((ulong)pbVar18 >> 6) * 8) >> ((ulong)pbVar18 & 0x3f) & 1)
                     != 0);
            bVar19 = pbVar10 <= pbVar18;
          }
          if (!bVar19) {
            pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_120[0] = local_110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"%s: right argument can not contain NULL values","");
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,*(long *)(pBVar7 + 0x60),
                       *(long *)(pBVar7 + 0x68) + *(long *)(pBVar7 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_178,(StringUtil *)local_120,&local_140,pbVar13);
            duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_178);
            __cxa_throw(pIVar12,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        if (lVar9 == 0) {
          dVar21 = 0.0;
          dVar22 = 0.0;
          dVar20 = 0.0;
        }
        else {
          dVar21 = 0.0;
          dVar22 = 0.0;
          dVar20 = 0.0;
          lVar14 = 0;
          do {
            dVar1 = *(double *)(lVar5 + (long)pbVar13 * 8 + lVar14 * 8);
            dVar2 = *(double *)(lVar4 + uVar11 * 8 + lVar14 * 8);
            dVar21 = dVar21 + dVar2 * dVar1;
            dVar22 = dVar22 + dVar2 * dVar2;
            dVar20 = dVar20 + dVar1 * dVar1;
            lVar14 = lVar14 + 1;
          } while (lVar9 != lVar14);
          dVar20 = dVar22 * dVar20;
        }
        if (dVar20 < 0.0) {
          local_158 = dVar21;
          dStack_150 = dVar22;
          dVar20 = sqrt(dVar20);
          dVar21 = local_158;
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar22 = 1.0;
        if (dVar21 / dVar20 <= 1.0) {
          dVar22 = dVar21 / dVar20;
        }
        if (dVar22 <= -1.0) {
          dVar22 = -1.0;
        }
        *(double *)(lVar6 + (long)pbVar15 * 8) = 1.0 - dVar22;
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pbVar15,true);
      }
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar15->_M_dataplus)._M_p + 1);
    } while (pbVar15 != pbVar3);
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}